

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

int gauden_double_variance(gauden_t *g)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  vector_t pfVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar2 = g->n_mgau;
  if ((ulong)uVar2 != 0) {
    uVar3 = g->n_feat;
    uVar7 = 0;
    do {
      if ((ulong)uVar3 != 0) {
        uVar4 = g->n_density;
        uVar9 = 0;
        do {
          if ((ulong)uVar4 != 0) {
            uVar5 = g->veclen[uVar9];
            uVar10 = 0;
            do {
              if ((ulong)uVar5 != 0) {
                pfVar6 = g->var[uVar7][uVar9][uVar10];
                uVar8 = 0;
                do {
                  fVar1 = pfVar6[uVar8];
                  pfVar6[uVar8] = fVar1 + fVar1;
                  uVar8 = uVar8 + 1;
                } while (uVar5 != uVar8);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar4);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar3);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar2);
  }
  return 0;
}

Assistant:

int
gauden_double_variance(gauden_t *g)
{
    uint32 i, j, k, l;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_density; k++) {
		for (l = 0; l < g->veclen[j]; l++) {
		    g->var[i][j][k][l] += g->var[i][j][k][l];
		}
	    }
	}
    }

    return S3_SUCCESS;
}